

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

Hashtable * __thiscall icu_63::ICUService::getVisibleIDMap(ICUService *this,UErrorCode *status)

{
  int iVar1;
  Hashtable *this_00;
  long *plVar2;
  code *p;
  uint uVar3;
  UHashtable *fillinResult;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->idCache != (Hashtable *)0x0) {
      return this->idCache;
    }
    p = (code *)status;
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)status);
    if (this_00 == (Hashtable *)0x0) {
      this->idCache = (Hashtable *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this_00->hash = (UHashtable *)0x0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        fillinResult = &this_00->hashObj;
        p = uhash_hashUnicodeString_63;
        uhash_init_63(fillinResult,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                      (undefined1 *)0x0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          this_00->hash = fillinResult;
          p = uprv_deleteUObject_63;
          uhash_setKeyDeleter_63(fillinResult,uprv_deleteUObject_63);
        }
      }
      this->idCache = this_00;
      if (this->factories == (UVector *)0x0) {
        return this_00;
      }
      iVar1 = this->factories->count;
      if (0 < iVar1) {
        uVar3 = iVar1 + 1;
        do {
          plVar2 = (long *)UVector::elementAt(this->factories,uVar3 - 2);
          p = (code *)this->idCache;
          (**(code **)(*plVar2 + 0x20))(plVar2,p,status);
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
        this_00 = this->idCache;
      }
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return this_00;
      }
      if ((this_00 != (Hashtable *)0x0) && (this_00->hash != (UHashtable *)0x0)) {
        uhash_close_63(this_00->hash);
      }
      UMemory::operator_delete((UMemory *)this_00,p);
      this->idCache = (Hashtable *)0x0;
    }
  }
  return (Hashtable *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}